

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * openFile(string *filename)

{
  _Ios_Openmode in_ESI;
  allocator local_31;
  string x;
  
  std::ifstream::ifstream(filename);
  std::ifstream::open((string *)filename,in_ESI);
  std::__cxx11::string::string((string *)&x,"",&local_31);
  if ((*(byte *)((long)&filename[1]._M_dataplus._M_p +
                *(long *)((filename->_M_dataplus)._M_p + -0x18)) & 5) == 0) {
    std::__cxx11::string::~string((string *)&x);
    return filename;
  }
  std::operator<<((ostream *)&std::cout,"Unable to open file");
  exit(1);
}

Assistant:

ifstream openFile(string filename){
    ifstream inFile;
    inFile.open(filename);
    string x = "";

    if (!inFile) {
        cout << "Unable to open file";
        exit(1); // terminate with error
    }
    return inFile;
}